

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> __thiscall
kj::anon_unknown_0::SocketNetwork::parseAddress(SocketNetwork *this,StringPtr addr,uint portHint)

{
  NetworkFilter *filter;
  PromiseArena *pPVar1;
  size_t sVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  int *piVar9;
  undefined4 in_register_0000000c;
  char *pcVar10;
  SimpleTransformPromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1741:13)>
  *location;
  Exception *value;
  NetworkFilter *in_R8;
  NetworkFilter *pNVar11;
  ulong __n;
  SocketAddress *pSVar12;
  kj *this_00;
  StringPtr value_00;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> array;
  StringPtr local_5f8;
  Fault f;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_5d0;
  LowLevelAsyncIoProvider local_5c8;
  int local_5bc;
  ArrayPtr<const_char> local_5b8;
  Exception *local_5a8;
  uint local_59c;
  unsigned_long port;
  char *local_590;
  char *endptr;
  SocketAddress local_580;
  Fault f_5;
  SocketAddress *pSStack_4f0;
  undefined6 uStack_4e0;
  undefined2 uStack_4da;
  NullableValue<kj::Exception> local_360;
  NullableValue<kj::Exception> _e1576;
  
  local_5f8.content.size_ = CONCAT44(in_register_0000000c,portHint);
  local_5f8.content.ptr = (char *)addr.content.size_;
  local_590 = addr.content.ptr;
  uVar7 = (ulong)in_R8 & 0xffffffff;
  local_5d0.ptr = (PromiseNode *)0x0;
  pNVar11 = in_R8;
  memset(&local_580,0,0x88);
  array.ptr = (SocketAddress *)anon_var_dwarf_23e420;
  array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x6;
  bVar4 = StringPtr::startsWith(&local_5f8,(StringPtr *)&array);
  filter = (NetworkFilter *)(local_590 + 0x10);
  if (bVar4) {
    pSVar12 = (SocketAddress *)(local_5f8.content.size_ - 6);
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x6c;
    array.endPtr = (SocketAddress *)anon_var_dwarf_5021b;
    array.disposer = (ArrayDisposer *)&DAT_00000004;
    array.ptr = pSVar12;
    if ((SocketAddress *)0x6b < pSVar12) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[40],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x3ef,FAILED,"path.size() < sizeof(addr.unixDomain.sun_path)",
                 "_kjCondition,\"Unix domain socket address is too long.\", str",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&array,
                 (char (*) [40])"Unix domain socket address is too long.",&local_5f8);
      kj::_::Debug::Fault::fatal(&f);
    }
    pcVar10 = (char *)((long)&(((String *)local_5f8.content.ptr)->content).ptr + 5);
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)strlen(pcVar10);
    array.endPtr = (SocketAddress *)anon_var_dwarf_4fea7;
    array.disposer = (ArrayDisposer *)&DAT_00000005;
    if (pSVar12 != array.pos) {
      array.ptr = pSVar12;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[91]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x3f2,FAILED,"path.size() == strlen(path.cStr())",
                 "_kjCondition,\"Unix domain socket address contains NULL. Use\" \" \'unix-abstract:\' for the abstract namespace.\""
                 ,(DebugComparison<unsigned_long,_unsigned_long> *)&array,
                 (char (*) [91])
                 "Unix domain socket address contains NULL. Use \'unix-abstract:\' for the abstract namespace."
                );
      kj::_::Debug::Fault::fatal(&f);
    }
    local_580.addr.generic.sa_family = 1;
    array.ptr = pSVar12;
    strcpy(local_580.addr.generic.sa_data,pcVar10);
    local_580.addrlen = (int)pSVar12 + 3;
    bVar4 = SocketAddress::parseAllowedBy(&local_580,filter);
    if (!bVar4) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
                ((Fault *)&array,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x3f8,FAILED,(char *)0x0,"\"unix sockets blocked by restrictPeers()\"",
                 (char (*) [40])0x44b2da);
      kj::_::Debug::Fault::fatal((Fault *)&array);
    }
    heapArrayBuilder<kj::(anonymous_namespace)::SocketAddress>(&array,1);
    memcpy(array.pos,&local_580,0x88);
    f.exception = (Exception *)array.ptr;
    array.ptr = (SocketAddress *)0x0;
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
    array.endPtr = (SocketAddress *)0x0;
    Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
              ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&local_5c8,
               (FixVoid<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&f);
    Array<kj::(anonymous_namespace)::SocketAddress>::~Array
              ((Array<kj::(anonymous_namespace)::SocketAddress> *)&f);
    ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::~ArrayBuilder(&array);
    goto LAB_003872e2;
  }
  array.ptr = (SocketAddress *)anon_var_dwarf_942e77;
  array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0xf;
  bVar4 = StringPtr::startsWith(&local_5f8,(StringPtr *)&array);
  sVar2 = local_5f8.content.size_;
  if (bVar4) {
    array.ptr = (SocketAddress *)(local_5f8.content.size_ - 0xe);
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x6c;
    array.endPtr = (SocketAddress *)anon_var_dwarf_5021b;
    array.disposer = (ArrayDisposer *)&DAT_00000004;
    if ((SocketAddress *)0x6b < array.ptr) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[40],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x404,FAILED,"path.size() + 1 < sizeof(addr.unixDomain.sun_path)",
                 "_kjCondition,\"Unix domain socket address is too long.\", str",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&array,
                 (char (*) [40])"Unix domain socket address is too long.",&local_5f8);
      kj::_::Debug::Fault::fatal(&f);
    }
    local_580.addr.generic.sa_family = 1;
    local_580.addr.inet4.sin_port = local_580.addr.inet4.sin_port & 0xff00;
    memcpy((void *)((long)&local_580.addr + 3),
           (void *)((long)&(((String *)local_5f8.content.ptr)->content).size_ + 6),(size_t)array.ptr
          );
    local_580.addrlen = (int)sVar2 - 0xc;
    bVar4 = SocketAddress::parseAllowedBy(&local_580,filter);
    if (!bVar4) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                ((Fault *)&array,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x40d,FAILED,(char *)0x0,"\"abstract unix sockets blocked by restrictPeers()\"",
                 (char (*) [49])"abstract unix sockets blocked by restrictPeers()");
      kj::_::Debug::Fault::fatal((Fault *)&array);
    }
    heapArrayBuilder<kj::(anonymous_namespace)::SocketAddress>(&array,1);
    memcpy(array.pos,&local_580,0x88);
    f.exception = (Exception *)array.ptr;
    array.ptr = (SocketAddress *)0x0;
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
    array.endPtr = (SocketAddress *)0x0;
    Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
              ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&local_5c8,
               (FixVoid<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&f);
    Array<kj::(anonymous_namespace)::SocketAddress>::~Array
              ((Array<kj::(anonymous_namespace)::SocketAddress> *)&f);
    ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::~ArrayBuilder(&array);
    goto LAB_003872e2;
  }
  local_5b8.ptr = (char *)0x0;
  local_5b8.size_ = 0;
  f_5.exception = (Exception *)0x44d24d;
  pSStack_4f0 = (SocketAddress *)0x2;
  bVar4 = StringPtr::startsWith(&local_5f8,(StringPtr *)&f_5);
  if (bVar4) {
    local_5bc = 10;
    StringPtr::findLast((StringPtr *)&f_5,(char)&local_5f8);
    if ((char)f_5.exception != '\x01') {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32],kj::StringPtr&>
                (&f_5,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x422,FAILED,"str.findLast(\']\') != nullptr",
                 "\"Unclosed \'[\' in address string.\", str",
                 (char (*) [32])"Unclosed \'[\' in address string.",&local_5f8);
      kj::_::Debug::Fault::fatal(&f_5);
    }
    value = (Exception *)((long)&(((String *)local_5f8.content.ptr)->content).ptr + 1);
    __n = 1;
    local_5b8.ptr = (char *)value;
    local_5b8.size_ = __n;
    if (local_5f8.content.size_ - 1 < 4) {
      pNVar11 = (NetworkFilter *)0xa;
      goto LAB_00386fc3;
    }
    f_5.exception = (Exception *)((long)&(((String *)local_5f8.content.ptr)->content).ptr + 3);
    pSStack_4f0 = (SocketAddress *)(local_5f8.content.size_ - 3);
    array.ptr = (SocketAddress *)0x44b6bf;
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x2;
    pSVar12 = pSStack_4f0;
    local_5a8 = value;
    bVar4 = StringPtr::startsWith((StringPtr *)&f_5,(StringPtr *)&array);
    f.exception._0_1_ = bVar4;
    if (!bVar4) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[32],kj::StringPtr&>
                (&f_5,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x427,FAILED,"str.slice(closeBracket + 1).startsWith(\":\")",
                 "_kjCondition,\"Expected port suffix after \']\'.\", str",
                 (DebugExpression<bool> *)&f,(char (*) [32])"Expected port suffix after \']\'.",
                 &local_5f8);
      kj::_::Debug::Fault::fatal(&f_5);
    }
    this_00 = (kj *)((long)&(((String *)local_5f8.content.ptr)->content).ptr + 4);
    pcVar10 = (char *)(local_5f8.content.size_ - 4);
    local_59c = 10;
LAB_00387255:
    uVar7 = strtoul((char *)this_00,&endptr,0);
    port = uVar7;
    if ((pcVar10 != (char *)0x1) && (pSVar12 = (SocketAddress *)endptr, *endptr == '\0')) {
      f_5.exception = (Exception *)&port;
      pSStack_4f0 = (SocketAddress *)CONCAT44(pSStack_4f0._4_4_,0x10000);
      uStack_4e0 = 4;
      uStack_4da = 0;
      if (0xffff < uVar7) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[23]>
                  ((Fault *)&array,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x448,FAILED,"port < 65536","_kjCondition,\"Port number too large.\"",
                   (DebugComparison<unsigned_long_&,_int> *)&f_5,
                   (char (*) [23])"Port number too large.");
        kj::_::Debug::Fault::fatal((Fault *)&array);
      }
      pNVar11 = (NetworkFilter *)(ulong)local_59c;
      value = local_5a8;
      goto LAB_00386fc3;
    }
    heapString((String *)&array,(char *)local_5a8,__n);
    value_00.content.size_ = (size_t)pSVar12;
    value_00.content.ptr = pcVar10;
    heapString((String *)&f,this_00,value_00);
    SocketAddress::lookupHost(&local_5c8,(String *)&array,(String *)&f,(uint)in_R8,pNVar11);
  }
  else {
    StringPtr::findFirst((StringPtr *)&f_5,(char)&local_5f8);
    if ((char)f_5.exception == '\x01') {
      __n = 2;
      pSVar12 = (SocketAddress *)((long)&(((String *)local_5f8.content.ptr)->content).ptr + 3);
      array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)
                  (local_5f8.content.size_ - 3);
      array.ptr = pSVar12;
      StringPtr::findFirst((StringPtr *)&f_5,(char)&array);
      if ((char)f_5.exception == '\0') {
        local_5bc = 2;
        local_5b8.ptr = local_5f8.content.ptr;
        local_5b8.size_ = 2;
        local_5a8 = (Exception *)local_5f8.content.ptr;
        this_00 = (kj *)((long)&(((String *)local_5f8.content.ptr)->content).ptr + 3);
        pcVar10 = (char *)(local_5f8.content.size_ - 3);
        local_59c = 2;
        goto LAB_00387255;
      }
      pNVar11 = (NetworkFilter *)0xa;
    }
    else {
      pNVar11 = (NetworkFilter *)0x2;
    }
    local_5bc = (int)pNVar11;
    __n = local_5f8.content.size_ - 1;
    value = (Exception *)local_5f8.content.ptr;
    local_5b8.ptr = local_5f8.content.ptr;
    local_5b8.size_ = __n;
LAB_00386fc3:
    uVar5 = (ushort)uVar7;
    port = uVar7;
    if ((__n == 1) && (*(char *)&(value->ownFile).content.ptr == '*')) {
      local_580.wildcard = true;
      local_580.addrlen = 0x1c;
      local_580.addr.generic.sa_family = 10;
      local_580.addr.inet4.sin_port = uVar5 << 8 | uVar5 >> 8;
      heapArrayBuilder<kj::(anonymous_namespace)::SocketAddress>
                ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)&f_5,1);
      memcpy(pSStack_4f0,&local_580,0x88);
      array.endPtr = (SocketAddress *)CONCAT26(uStack_4da,uStack_4e0);
      array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)
                  ((long)((long)pSStack_4f0 + (0x88 - (long)f_5.exception)) / 0x88);
      array.ptr = (SocketAddress *)f_5.exception;
      f_5.exception = (Exception *)0x0;
      Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
                ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&local_5c8,
                 (FixVoid<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&array);
      Array<kj::(anonymous_namespace)::SocketAddress>::~Array
                ((Array<kj::(anonymous_namespace)::SocketAddress> *)&array);
      ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::~ArrayBuilder
                ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)&f_5);
      goto LAB_003872e2;
    }
    local_580.addr.inet4.sin_port = uVar5 << 8 | uVar5 >> 8;
    iVar6 = (int)pNVar11;
    local_580.addrlen = 0x10;
    if (iVar6 == 10) {
      local_580.addrlen = 0x1c;
    }
    local_580.addr.generic.sa_family = (ushort)(iVar6 == 10) * 8 + 2;
    if (__n < 0x2d) {
      f_5.exception = (Exception *)0x0;
      local_5a8 = value;
      memcpy(&f_5,value,__n);
      *(undefined1 *)((long)&f_5.exception + __n) = 0;
      iVar6 = inet_pton(iVar6,(char *)&f_5,
                        (void *)((long)&local_580.addr + (ulong)(iVar6 == 10) * 4 + 4));
      if (iVar6 == 1) {
        bVar4 = SocketAddress::parseAllowedBy(&local_580,filter);
        if (!bVar4) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
                    ((Fault *)&array,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x47a,FAILED,(char *)0x0,"\"address family blocked by restrictPeers()\"",
                     (char (*) [42])"address family blocked by restrictPeers()");
          kj::_::Debug::Fault::fatal((Fault *)&array);
        }
        heapArrayBuilder<kj::(anonymous_namespace)::SocketAddress>(&array,1);
        memcpy(array.pos,&local_580,0x88);
        f.exception = (Exception *)array.ptr;
        array.ptr = (SocketAddress *)0x0;
        array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
        array.endPtr = (SocketAddress *)0x0;
        Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
                  ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&local_5c8,
                   (FixVoid<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&f);
        Array<kj::(anonymous_namespace)::SocketAddress>::~Array
                  ((Array<kj::(anonymous_namespace)::SocketAddress> *)&f);
        ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::~ArrayBuilder(&array);
        goto LAB_003872e2;
      }
      value = local_5a8;
      if (iVar6 != 0) {
        piVar9 = __errno_location();
        kj::_::Debug::Fault::Fault<int,int&,kj::ArrayPtr<char_const>&>
                  ((Fault *)&array,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x486,*piVar9,"inet_pton","af, addrPart",&local_5bc,&local_5b8);
        kj::_::Debug::Fault::fatal((Fault *)&array);
      }
    }
    heapString((String *)&array,(char *)value,__n);
    f.exception = (Exception *)0x0;
    SocketAddress::lookupHost(&local_5c8,(String *)&array,(String *)&f,(uint)port,pNVar11);
  }
  Array<char>::~Array((Array<char> *)&f);
  Array<char>::~Array((Array<char> *)&array);
LAB_003872e2:
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            (&local_5d0,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_5c8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_5c8);
  local_360._0_8_ = local_360._0_8_ & 0xffffffffffffff00;
  kj::_::NullableValue<kj::Exception>::NullableValue(&_e1576,&local_360);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_360);
  if (_e1576.isSet == true) {
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)&f_5,&_e1576.field_1.value);
    local_5b8.ptr = (char *)f_5;
    f_5.exception = (Exception *)0x0;
    local_360._0_8_ = 0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_360);
    Own<kj::_::ImmediateBrokenPromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::ImmediateBrokenPromiseNode,_kj::_::PromiseDisposer> *)&f_5);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              (&local_5d0,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_5b8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_5b8);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&_e1576);
  OVar3.ptr = local_5d0.ptr;
  local_5b8.ptr = local_590;
  _e1576._0_8_ = kj::_::
                 SimpleTransformPromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1741:13)>
                 ::anon_class_8_1_8991fb9c_for_func::operator();
  pPVar1 = ((local_5d0.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_5d0.ptr - (long)pPVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1741:13)>
                *)((long)pvVar8 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>,kj::(anonymous_namespace)::SocketNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda(kj::Array<kj::(anonymous_namespace)::SocketAddress>)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::SocketNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda(kj::Array<kj::(anonymous_namespace)::SocketAddress>)_1_,void*&>
              (location,&local_5d0,(anon_class_8_1_8991fb9c_for_func *)&local_5b8,(void **)&_e1576);
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((local_5d0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location = (SimpleTransformPromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1741:13)>
                *)&local_5d0.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>,kj::(anonymous_namespace)::SocketNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda(kj::Array<kj::(anonymous_namespace)::SocketAddress>)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::SocketNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda(kj::Array<kj::(anonymous_namespace)::SocketAddress>)_1_,void*&>
              (location,&local_5d0,(anon_class_8_1_8991fb9c_for_func *)&local_5b8,(void **)&_e1576);
    OVar3.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_360.isSet = false;
  local_360._1_7_ = 0;
  (this->super_Network)._vptr_Network = (_func_int **)location;
  f_5.exception = (Exception *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f_5);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_360);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_5d0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<NetworkAddress>> parseAddress(StringPtr addr, uint portHint = 0) override {
    return evalNow([&]() {
      return SocketAddress::parse(lowLevel, addr, portHint, filter);
    }).then([this](Array<SocketAddress> addresses) -> Own<NetworkAddress> {
      return heap<NetworkAddressImpl>(lowLevel, filter, kj::mv(addresses));
    });
  }